

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O0

void beltWBLStepD2(void *buf1,void *buf2,size_t count,void *state)

{
  void *dest;
  u32 *in_RCX;
  undefined1 *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  size_t i;
  word n;
  belt_wbl_st *st;
  undefined1 *in_stack_ffffffffffffffc8;
  
  dest = (void *)((ulong)(in_RDX + 0xf) >> 4);
  *(long *)(in_RCX + 0x10) = (long)dest << 1;
  while (*(long *)(in_RCX + 0x10) != 0) {
    *(ulong *)(in_RCX + 8) = *in_RSI;
    *(ulong *)(in_RCX + 10) = in_RSI[1];
    memCopy(dest,in_stack_ffffffffffffffc8,0x141fe5);
    memMove(dest,in_stack_ffffffffffffffc8,0x142001);
    *in_RDI = *(ulong *)(in_RCX + 8);
    in_RDI[1] = *(ulong *)(in_RCX + 10);
    beltBlockEncr((octet *)(in_RCX + 8),in_RCX);
    memXor2(in_RCX + 8,in_RCX + 0x10,8);
    *in_RSI = *(ulong *)(in_RCX + 8) ^ *in_RSI;
    in_RSI[1] = *(ulong *)(in_RCX + 10) ^ in_RSI[1];
    for (in_stack_ffffffffffffffc8 = &DAT_00000010; in_stack_ffffffffffffffc8 + 0x20 < in_RDX;
        in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 0x10) {
      *in_RDI = *(ulong *)((long)in_RDI + (long)in_stack_ffffffffffffffc8) ^ *in_RDI;
      in_RDI[1] = *(ulong *)((long)(in_RDI + 1) + (long)in_stack_ffffffffffffffc8) ^ in_RDI[1];
    }
    if (in_stack_ffffffffffffffc8 + 0x10 < in_RDX) {
      memXor2(in_RDI,(undefined1 *)((long)in_RDI + (long)in_stack_ffffffffffffffc8),
              (size_t)(in_RDX + (-0x10 - (long)in_stack_ffffffffffffffc8)));
      memXor2((undefined1 *)
              ((long)in_RDI + (long)(in_RDX + (-0x10 - (long)in_stack_ffffffffffffffc8))),in_RSI,
              (size_t)(in_stack_ffffffffffffffc8 + (0x20 - (long)in_RDX)));
    }
    *(long *)(in_RCX + 0x10) = *(long *)(in_RCX + 0x10) + -1;
  }
  return;
}

Assistant:

void beltWBLStepD2(void* buf1, void* buf2, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	word n = ((word)count + 15) / 16;
	// pre
	ASSERT(count >= 32);
	ASSERT(memIsDisjoint3(buf1, count - 16, buf2, 16, state, beltWBL_keep()));
	for (st->round = 2 * n; st->round; --st->round)
	{
		size_t i;
		// block <- r*
		beltBlockCopy(st->block, buf2);
		// r <- ShHi^128(r)
		memCopy(buf2, (octet*)buf1 + count - 32, 16);
		memMove((octet*)buf1 + 16, buf1, count - 32);
		// r1 <- block
		beltBlockCopy(buf1, st->block);
		// block <- beltBlockEncr(block) + <round>
		beltBlockEncr(st->block, st->key);
#if (OCTET_ORDER == LITTLE_ENDIAN)
		memXor2(st->block, &st->round, O_PER_W);
#else // BIG_ENDIAN
		st->round = wordRev(st->round);
		memXor2(st->block, &st->round, O_PER_W);
		st->round = wordRev(st->round);
#endif // OCTET_ORDER
		// r* <- r* + block
		beltBlockXor2(buf2, st->block);
		// r1 <- r1 + r2 + ... + r_{n-1}
		for (i = 16; i + 32 < count; i += 16)
			beltBlockXor2(buf1, (octet*)buf1 + i);
		ASSERT(i + 16 <= count && i + 32 >= count);
		if (i + 16 < count)
		{
			memXor2(buf1, (octet*)buf1 + i, count - 16 - i);
			memXor2((octet*)buf1 + count - 16 - i, buf2, 32 + i - count);
		}
	}
}